

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

void __thiscall o3dgc::Adaptive_Data_Model::update(Adaptive_Data_Model *this,bool from_encoder)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint max_cycle;
  uint w;
  uint scale;
  uint s;
  uint sum;
  uint k;
  uint n;
  bool from_encoder_local;
  Adaptive_Data_Model *this_local;
  
  uVar2 = this->update_cycle + this->total_count;
  this->total_count = uVar2;
  if (0x8000 < uVar2) {
    this->total_count = 0;
    for (sum = 0; sum < this->data_symbols; sum = sum + 1) {
      uVar2 = this->symbol_count[sum] + 1 >> 1;
      this->symbol_count[sum] = uVar2;
      this->total_count = uVar2 + this->total_count;
    }
  }
  if (this->total_count == 0) {
    __assert_fail("total_count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/Open3DGC/o3dgcArithmeticCodec.cpp"
                  ,0x337,"void o3dgc::Adaptive_Data_Model::update(bool)");
  }
  scale = 0;
  w = 0;
  iVar3 = (int)(0x80000000 / (ulong)this->total_count);
  if ((from_encoder) || (this->table_size == 0)) {
    for (s = 0; s < this->data_symbols; s = s + 1) {
      this->distribution[s] = iVar3 * scale >> 0x10;
      scale = this->symbol_count[s] + scale;
    }
  }
  else {
    if (this->decoder_table == (uint *)0x0) {
      __assert_fail("decoder_table",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/Open3DGC/o3dgcArithmeticCodec.cpp"
                    ,0x342,"void o3dgc::Adaptive_Data_Model::update(bool)");
    }
    for (s = 0; s < this->data_symbols; s = s + 1) {
      this->distribution[s] = iVar3 * scale >> 0x10;
      scale = this->symbol_count[s] + scale;
      uVar2 = this->distribution[s];
      uVar1 = this->table_shift;
      while (w < uVar2 >> ((byte)uVar1 & 0x1f)) {
        w = w + 1;
        this->decoder_table[w] = s - 1;
      }
    }
    *this->decoder_table = 0;
    while (w <= this->table_size) {
      w = w + 1;
      this->decoder_table[w] = this->data_symbols - 1;
    }
  }
  this->update_cycle = this->update_cycle * 5 >> 2;
  uVar2 = (this->data_symbols + 6) * 8;
  if (uVar2 < this->update_cycle) {
    this->update_cycle = uVar2;
  }
  this->symbols_until_update = this->update_cycle;
  return;
}

Assistant:

void Adaptive_Data_Model::update(bool from_encoder)
    {
                                       // halve counts when a threshold is reached

      if ((total_count += update_cycle) > DM__MaxCount) {
        total_count = 0;
        for (unsigned n = 0; n < data_symbols; n++)
          total_count += (symbol_count[n] = (symbol_count[n] + 1) >> 1);
      }
      assert(total_count > 0);
                                 // compute cumulative distribution, decoder table
      unsigned k, sum = 0, s = 0;
      unsigned scale = 0x80000000U / total_count;

      if (from_encoder || (table_size == 0))
        for (k = 0; k < data_symbols; k++) {
          distribution[k] = (scale * sum) >> (31 - DM__LengthShift);
          sum += symbol_count[k];
        }
      else {
        assert(decoder_table);
        for (k = 0; k < data_symbols; k++) {
          distribution[k] = (scale * sum) >> (31 - DM__LengthShift);
          sum += symbol_count[k];
          unsigned w = distribution[k] >> table_shift;
          while (s < w) decoder_table[++s] = k - 1;
        }
        decoder_table[0] = 0;
        while (s <= table_size) decoder_table[++s] = data_symbols - 1;
      }
                                                 // set frequency of model updates
      update_cycle = (5 * update_cycle) >> 2;
      unsigned max_cycle = (data_symbols + 6) << 3;
      if (update_cycle > max_cycle) update_cycle = max_cycle;
      symbols_until_update = update_cycle;
    }